

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O3

int strcat_s(char *dst,size_t dstSizeInBytes,char *src)

{
  size_t sVar1;
  size_t sVar2;
  ulong __n;
  int iVar3;
  ulong uVar4;
  
  if (dst == (char *)0x0) {
    return 0x16;
  }
  if (src == (char *)0x0) {
    iVar3 = 0x16;
  }
  else {
    iVar3 = 0x22;
    if (dstSizeInBytes != 0) {
      sVar1 = strlen(src);
      sVar2 = 0;
      uVar4 = dstSizeInBytes;
      while (dst[sVar2] != '\0') {
        sVar2 = sVar2 + 1;
        uVar4 = uVar4 - 1;
        if (dstSizeInBytes == sVar2) {
          return 0x16;
        }
      }
      __n = dstSizeInBytes - sVar2;
      if (__n == 0) {
        return 0x16;
      }
      if (sVar1 + sVar2 < dstSizeInBytes) {
        if (sVar1 <= __n) {
          __n = sVar1;
        }
        memcpy(dst + sVar2,src,__n);
        if (sVar1 < uVar4) {
          uVar4 = sVar1;
        }
        dst = dst + sVar2 + uVar4;
        iVar3 = 0;
      }
    }
  }
  *dst = '\0';
  return iVar3;
}

Assistant:

int strcat_s(char* dst, size_t dstSizeInBytes, const char* src)
{
    int result;
    /*Codes_SRS_CRT_ABSTRACTIONS_99_004: [If dst is NULL or unterminated, the error code returned shall be EINVAL & dst shall not be modified.]*/
    if (dst == NULL)
    {
        result = EINVAL;
    }
    /*Codes_SRS_CRT_ABSTRACTIONS_99_005: [If src is NULL, the error code returned shall be EINVAL and dst[0] shall be set to 0.]*/
    else if (src == NULL)
    {
        dst[0] = '\0';
        result = EINVAL;
    }
    else
    {
        /*Codes_SRS_CRT_ABSTRACTIONS_99_006: [If the dstSizeInBytes is 0 or smaller than the required size for dst & src, the error code returned shall be ERANGE & dst[0] set to 0.]*/
        if (dstSizeInBytes == 0)
        {
            result = ERANGE;
            dst[0] = '\0';
        }
        else
        {
            size_t dstStrLen = 0;
            size_t src_len = strlen(src);
#ifdef __STDC_LIB_EXT1__
            dstStrLen = strnlen_s(dst, dstSizeInBytes);
#else
            size_t i;
            for(i=0; (i < dstSizeInBytes) && (dst[i]!= '\0'); i++)
            {
            }
            dstStrLen = i;
#endif
            /*Codes_SRS_CRT_ABSTRACTIONS_99_004: [If dst is NULL or unterminated, the error code returned shall be EINVAL & dst shall not be modified.]*/
            if (dstSizeInBytes == dstStrLen) /* this means the dst string is not terminated*/
            {
                result = EINVAL;
            }
            // If we are instructed to write too much data to the buffer
            // return ERANGE
            else if ((src_len + dstStrLen) >= dstSizeInBytes)
            {
                dst[0] = '\0';
                result = ERANGE;
            }
            else
            {
                // memcpy should at most copy the result of strlen(src) or there may be
                // some issues with copying unwanted memory
                size_t bytes_to_cpy = dstSizeInBytes - dstStrLen;
                if (bytes_to_cpy > src_len)
                {
                    bytes_to_cpy = src_len;
                }

                /*Codes_SRS_CRT_ABSTRACTIONS_99_009: [The initial character of src shall overwrite the terminating null character of dst.]*/
                if (memcpy(&dst[dstStrLen], src, bytes_to_cpy) == NULL)
                /*Codes_SRS_CRT_ABSTRACTIONS_99_006: [If the dstSizeInBytes is 0 or smaller than the required size for dst & src, the error code returned shall be ERANGE & dst[0] set to 0.]*/
                {
                    dst[0] = '\0';
                    result = ERANGE;
                }
                else
                {
                    /*Codes_SRS_CRT_ABSTRACTIONS_99_003: [strcat_s shall return Zero upon success.]*/
                    dst[dstStrLen+bytes_to_cpy] = '\0';
                    result = 0;
                }
            }
        }
    }
    return result;
}